

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle_00;
  int iVar1;
  long *plVar2;
  uv_stat_t *b;
  ulong uVar3;
  uint64_t uVar4;
  uv_fs_poll_t *handle;
  uint64_t interval;
  poll_ctx *ctx;
  uv_stat_t *statbuf;
  uv_fs_t *req_local;
  
  plVar2 = &req[-1].statbuf.st_ctim.tv_nsec;
  handle_00 = (uv_handle_t *)*plVar2;
  iVar1 = uv_is_active(handle_00);
  if ((iVar1 != 0) && ((handle_00->flags & 3) == 0)) {
    if (req->result == 0) {
      b = &req->statbuf;
      if (((int)req[-1].statbuf.st_birthtim.tv_sec != 0) &&
         (((int)req[-1].statbuf.st_birthtim.tv_sec < 0 ||
          (iVar1 = statbuf_eq((uv_stat_t *)(req + 1),b), iVar1 == 0)))) {
        (**(code **)&req[-1].file)(*plVar2,0,req + 1,b);
      }
      memcpy(req + 1,b,0xa0);
      *(undefined4 *)&req[-1].statbuf.st_birthtim.tv_sec = 1;
    }
    else if ((long)(int)req[-1].statbuf.st_birthtim.tv_sec != req->result) {
      (**(code **)&req[-1].file)(*plVar2,req->result & 0xffffffff,req + 1,&zero_statbuf);
      *(int *)&req[-1].statbuf.st_birthtim.tv_sec = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar1 = uv_is_active(handle_00);
  if ((iVar1 == 0) || ((handle_00->flags & 3) != 0)) {
    uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
  }
  else {
    uVar3 = (ulong)*(uint *)((long)&req[-1].statbuf.st_birthtim.tv_sec + 4);
    uVar4 = uv_now((uv_loop_t *)req[-1].new_path);
    iVar1 = uv_timer_start((uv_timer_t *)&req[-1].mode,timer_cb,
                           uVar3 - (uVar4 - req[-1].statbuf.st_birthtim.tv_nsec) % uVar3,0);
    if (iVar1 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT(handle == &poll_handle);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));
  ASSERT(prev != NULL);
  ASSERT(curr != NULL);

  switch (poll_cb_called++) {
  case 0:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT(status == 0);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}